

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_hash_compute(psa_algorithm_t alg,uint8_t *input,size_t input_length,uint8_t *hash,
                size_t hash_size,size_t *hash_length)

{
  int local_11c;
  undefined1 local_118 [4];
  psa_status_t status;
  psa_hash_operation_t operation;
  size_t *hash_length_local;
  size_t hash_size_local;
  uint8_t *hash_local;
  size_t input_length_local;
  uint8_t *input_local;
  psa_algorithm_t alg_local;
  
  operation.ctx._208_8_ = hash_length;
  memset(local_118,0,0xe0);
  *(size_t *)operation.ctx._208_8_ = hash_size;
  local_11c = psa_hash_setup((psa_hash_operation_t *)local_118,alg);
  if ((local_11c == 0) &&
     (local_11c = psa_hash_update((psa_hash_operation_t *)local_118,input,input_length),
     local_11c == 0)) {
    local_11c = psa_hash_finish((psa_hash_operation_t *)local_118,hash,hash_size,
                                (size_t *)operation.ctx._208_8_);
  }
  if (local_11c == 0) {
    local_11c = psa_hash_abort((psa_hash_operation_t *)local_118);
  }
  else {
    psa_hash_abort((psa_hash_operation_t *)local_118);
  }
  return local_11c;
}

Assistant:

psa_status_t psa_hash_compute( psa_algorithm_t alg,
                               const uint8_t *input, size_t input_length,
                               uint8_t *hash, size_t hash_size,
                               size_t *hash_length )
{
    psa_hash_operation_t operation = PSA_HASH_OPERATION_INIT;
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;

    *hash_length = hash_size;
    status = psa_hash_setup( &operation, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    status = psa_hash_update( &operation, input, input_length );
    if( status != PSA_SUCCESS )
        goto exit;
    status = psa_hash_finish( &operation, hash, hash_size, hash_length );
    if( status != PSA_SUCCESS )
        goto exit;

exit:
    if( status == PSA_SUCCESS )
        status = psa_hash_abort( &operation );
    else
        psa_hash_abort( &operation );
    return( status );
}